

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O1

int IoTHubTransportHttp_SetRetryPolicy
              (TRANSPORT_LL_HANDLE handle,IOTHUB_CLIENT_RETRY_POLICY retryPolicy,
              size_t retryTimeoutLimitInSeconds)

{
  return 0;
}

Assistant:

static int IoTHubTransportHttp_SetRetryPolicy(TRANSPORT_LL_HANDLE handle, IOTHUB_CLIENT_RETRY_POLICY retryPolicy, size_t retryTimeoutLimitInSeconds)
{
    int result;
    (void)handle;
    (void)retryPolicy;
    (void)retryTimeoutLimitInSeconds;

    /* Retry Policy is not currently not available for HTTP */

    result = 0;
    return result;
}